

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall
SQCompiler::BIN_EXP<void(SQCompiler::*)()>
          (SQCompiler *this,SQOpcode op,offset_in_SQCompiler_to_subr f,SQInteger op3)

{
  SQFuncState *this_00;
  undefined4 uVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  SQInteger SVar4;
  long *plVar5;
  SQExpState es;
  SQInstruction local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  SVar2 = SQLexer::Lex(&this->_lex);
  this->_token = SVar2;
  local_38 = *(undefined8 *)&(this->_es).donot_get;
  local_48._arg1 = (SQInt32)(this->_es).etype;
  uVar1 = *(undefined4 *)((long)&(this->_es).etype + 4);
  uStack_40 = (undefined4)(this->_es).epos;
  uStack_3c = *(undefined4 *)((long)&(this->_es).epos + 4);
  local_48.op = (uchar)uVar1;
  local_48._arg0 = (uchar)((uint)uVar1 >> 8);
  local_48._arg2 = (uchar)((uint)uVar1 >> 0x10);
  local_48._arg3 = (uchar)((uint)uVar1 >> 0x18);
  (this->_es).etype = 1;
  (this->_es).epos = -1;
  (this->_es).donot_get = false;
  plVar5 = (long *)((long)&this->_token + op3);
  if ((f & 1) != 0) {
    f = *(undefined8 *)(*plVar5 + -1 + f);
  }
  (*(code *)f)(plVar5);
  *(undefined8 *)&(this->_es).donot_get = local_38;
  (this->_es).etype =
       CONCAT17(local_48._arg3,
                CONCAT16(local_48._arg2,
                         CONCAT15(local_48._arg0,CONCAT14(local_48.op,local_48._arg1))));
  (this->_es).epos = CONCAT44(uStack_3c,uStack_40);
  SVar2 = SQFuncState::PopTarget(this->_fs);
  SVar3 = SQFuncState::PopTarget(this->_fs);
  this_00 = this->_fs;
  SVar4 = SQFuncState::PushTarget(this_00,-1);
  local_48._arg0 = (uchar)SVar4;
  local_48._arg1 = (SQInt32)SVar2;
  local_48._arg2 = (uchar)SVar3;
  local_48.op = (uchar)op;
  SQFuncState::AddInstruction(this_00,&local_48);
  (this->_es).etype = 1;
  return;
}

Assistant:

void BIN_EXP(SQOpcode op, T f,SQInteger op3 = 0)
    {
        Lex();
        INVOKE_EXP(f);
        SQInteger op1 = _fs->PopTarget();SQInteger op2 = _fs->PopTarget();
        _fs->AddInstruction(op, _fs->PushTarget(), op1, op2, op3);
		_es.etype = EXPR;
    }